

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# deserializer.hpp
# Opt level: O0

type * __thiscall
duckdb::Deserializer::Read<duckdb::vector<duckdb::PivotColumn,true>>(Deserializer *this)

{
  ulong uVar1;
  long *in_RSI;
  value_type *in_RDI;
  idx_t i;
  idx_t size;
  vector<duckdb::PivotColumn,_true> *vec;
  value_type *this_00;
  Deserializer *in_stack_ffffffffffffff68;
  undefined8 local_38;
  
  this_00 = in_RDI;
  vector<duckdb::PivotColumn,_true>::vector((vector<duckdb::PivotColumn,_true> *)0xb699ed);
  uVar1 = (**(code **)(*in_RSI + 0x40))();
  for (local_38 = 0; local_38 < uVar1; local_38 = local_38 + 1) {
    Read<duckdb::PivotColumn>(in_stack_ffffffffffffff68);
    ::std::vector<duckdb::PivotColumn,_std::allocator<duckdb::PivotColumn>_>::push_back
              ((vector<duckdb::PivotColumn,_std::allocator<duckdb::PivotColumn>_> *)this_00,in_RDI);
    PivotColumn::~PivotColumn(this_00);
  }
  (**(code **)(*in_RSI + 0x48))();
  return (type *)this_00;
}

Assistant:

inline typename std::enable_if<is_vector<T>::value, T>::type Read() {
		using ELEMENT_TYPE = typename is_vector<T>::ELEMENT_TYPE;
		T vec;
		auto size = OnListBegin();
		for (idx_t i = 0; i < size; i++) {
			vec.push_back(Read<ELEMENT_TYPE>());
		}
		OnListEnd();
		return vec;
	}